

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O3

void __thiscall phpconvert::ZendParser::~ZendParser(ZendParser *this)

{
  vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_> *this_00;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *pvVar1;
  
  (this->super_BaseParser)._vptr_BaseParser = (_func_int **)&PTR__ZendParser_00145f00;
  if (this->reader != (DirectoryReader *)0x0) {
    (*this->reader->_vptr_DirectoryReader[1])();
  }
  if (this->stringHelper != (StringHelper *)0x0) {
    (*this->stringHelper->_vptr_StringHelper[1])();
  }
  this_00 = this->results;
  if (this_00 !=
      (vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_> *)0x0) {
    std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>::
    ~vector(this_00);
  }
  operator_delete(this_00);
  pvVar1 = this->typesRegistry;
  if (pvVar1 != (vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                 *)0x0) {
    std::
    vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
    ::~vector(pvVar1);
  }
  operator_delete(pvVar1);
  pvVar1 = this->typesRegistryUnfiltered;
  if (pvVar1 != (vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                 *)0x0) {
    std::
    vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
    ::~vector(pvVar1);
  }
  operator_delete(pvVar1);
  BaseParser::~BaseParser(&this->super_BaseParser);
  return;
}

Assistant:

ZendParser::~ZendParser() { //make all pointers delete try catch (cascade)
        delete reader;
        delete stringHelper;
        delete results;
        delete typesRegistry;
        delete typesRegistryUnfiltered;
    }